

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall CTestGen9Resource_TestCCS_Test::TestBody(CTestGen9Resource_TestCCS_Test *this)

{
  int iVar1;
  anon_struct_8_45_9b07292e_for_Gpu aVar2;
  uint32_t uVar3;
  CTestGen9Resource_TestCCS_Test *this_00;
  uint32_t uVar4;
  long lVar5;
  GMM_RESOURCE_INFO *ResourceInfo;
  undefined *puVar6;
  int *piVar7;
  anon_union_8_3_ffc73876_for_GMM_RESCREATE_PARAMS_REC_6 aVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint32_t TestDimensions [4] [3];
  vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
  List;
  GMM_RESCREATE_PARAMS local_c8;
  long local_40;
  CTestGen9Resource_TestCCS_Test *local_38;
  
  TestDimensions[0][2] = 0;
  TestDimensions[1][0] = 0;
  TestDimensions[2][0] = 0;
  TestDimensions[0][0] = 0;
  TestDimensions[0][1] = 1;
  TestDimensions[1][1] = 1;
  TestDimensions[1][2] = 1;
  TestDimensions[2][1] = 1;
  TestDimensions[2][2] = 1;
  TestDimensions[3][0] = 1;
  TestDimensions[3][1] = 0;
  TestDimensions[3][2] = 0;
  local_38 = this;
  BuildInputIterator((vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
                      *)(TestDimensions[3] + 1),4,2);
  lVar5 = local_40;
  for (piVar7 = (int *)TestDimensions[3]._4_8_; piVar7 != (int *)0x0; piVar7 = piVar7 + 5) {
    iVar1 = *piVar7;
    local_40 = (long)piVar7[1];
    uVar9 = piVar7[2];
    aVar8._0_4_ = piVar7[3];
    uVar10 = (ulong)aVar8._0_4_;
    lVar11 = (long)piVar7[4];
    local_c8.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    local_c8.MultiTileArch._0_1_ = 0;
    local_c8.MultiTileArch.GpuVaMappingSet = '\0';
    local_c8.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_c8.MultiTileArch.LocalMemPreferredSet = '\0';
    local_c8.MultiTileArch.Reserved = 0;
    local_c8.ExistingSysMemSize = 0;
    local_c8.MaximumRenamingListLength = 0;
    local_c8.NoGfxMemory = '\0';
    local_c8._109_3_ = 0;
    local_c8.RotateInfo = 0;
    local_c8._84_4_ = 0;
    local_c8.pExistingSysMem = 0;
    local_c8.MaxLod = 0;
    local_c8.ArraySize = 0;
    local_c8.BaseAlignment = 0;
    local_c8.OverridePitch = 0;
    local_c8.field_6.BaseWidth64 = 0;
    local_c8.BaseHeight = 0;
    local_c8.Depth = 0;
    local_c8.MSAA.NumSamples = 0;
    local_c8.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    local_c8.CpTag = 0;
    local_c8._44_4_ = 0;
    local_c8.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    local_c8.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    local_c8.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    local_c8.Type = RESOURCE_INVALID;
    local_c8.Format = GMM_FORMAT_INVALID;
    local_c8.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    if (((1 < lVar11) && (uVar10 == 4 || (aVar8._0_4_ & 0xfffffffe) == 2)) &&
       ((uVar9 & 0xfffffffb) != 0)) {
      CTestResource::SetTileFlag((CTestResource *)local_38,&local_c8,piVar7[4]);
      aVar2 = local_c8.Flags.Gpu;
      local_c8.Type = uVar9 + RESOURCE_1D;
      if (uVar9 == 4) {
        local_c8.Type = RESOURCE_BUFFER;
      }
      local_c8.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)local_c8.Flags.Gpu & 0xffffffffff7fffbf | 0x800000);
      local_c8.ArraySize = *(uint32_t *)(&DAT_001ab7ac + (long)iVar1 * 4);
      local_c8.NoGfxMemory = '\x01';
      local_c8.Format = GMM_FORMAT_INVALID;
      if (aVar8._0_4_ < 5) {
        local_c8.Format = (&DAT_001ad00c)[uVar10];
      }
      puVar6 = &DAT_001acbe0;
      if (uVar9 == 2) {
        puVar6 = &DAT_001acd90;
      }
      uVar9 = *(uint *)(&DAT_001acf54 + uVar10 * 4);
      aVar8._0_4_ = TestDimensions[local_40 + -1][1] *
                    *(int *)(puVar6 + uVar10 * 0xc + lVar11 * 0x3c) + 1;
      aVar8.BaseWidth64._4_4_ = 0;
      local_c8.field_6 = aVar8;
      if (local_c8.Type != RESOURCE_CUBE) {
        aVar8._0_4_ = *(int *)(puVar6 + uVar10 * 0xc + lVar11 * 0x3c + 4) *
                      TestDimensions[local_40 + -1][2] + 1;
      }
      local_c8.BaseHeight = aVar8._0_4_;
      local_c8.Depth = 1;
      if (local_c8.Type == RESOURCE_3D) {
        local_c8.Depth =
             *(int *)(puVar6 + uVar10 * 0xc + lVar11 * 0x3c + 8) * TestDimensions[local_40][0] + 1;
      }
      local_c8.MSAA.NumSamples = 1;
      local_c8.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar2 & 0xffffffffff7fffbd | 0x800000);
      lVar5 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                        (CommonULT::pGmmULTClientContext,&local_c8);
      if (lVar5 != 0) {
        local_c8.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_c8.Flags.Gpu | 2);
        local_40 = lVar5;
        ResourceInfo = (GMM_RESOURCE_INFO *)
                       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                 (CommonULT::pGmmULTClientContext,&local_c8);
        this_00 = local_38;
        CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_38,ResourceInfo,0x80);
        CTestResource::VerifyResourceVAlign<true>((CTestResource *)this_00,ResourceInfo,0x40);
        uVar9 = (int)((local_c8.field_6.BaseWidth64 + 0x7f & 0xffffffffffffff80) / (ulong)uVar9) +
                0x7f;
        aVar8._0_4_ = uVar9 & 0xffffff80;
        CTestResource::VerifyResourcePitch<true>((CTestResource *)this_00,ResourceInfo,aVar8._0_4_);
        CTestResource::VerifyResourcePitchInTiles<true>
                  ((CTestResource *)this_00,ResourceInfo,uVar9 >> 7);
        uVar9 = local_c8.BaseHeight + 0x3f & 0xffffffc0;
        if ((1 < local_c8.ArraySize) || (local_c8.Type - RESOURCE_3D < 2)) {
          uVar3 = local_c8.Depth;
          CTestResource::VerifyResourceQPitch<true>
                    ((CTestResource *)local_38,ResourceInfo,(ulong)uVar9);
          uVar4 = (uint)(local_c8.Type == RESOURCE_CUBE) * 5 + 1;
          if (local_c8.Type == RESOURCE_3D) {
            uVar4 = uVar3;
          }
          local_c8.ArraySize = uVar4 * local_c8.ArraySize;
        }
        CTestResource::VerifyResourceSize<true>
                  ((CTestResource *)local_38,ResourceInfo,
                   (ulong)(((uVar9 >> 4) * local_c8.ArraySize + 0x1f & 0xffffffe0) * aVar8._0_4_));
        lVar5 = local_40;
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo);
      }
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                (CommonULT::pGmmULTClientContext,lVar5);
      lVar5 = local_40;
    }
    local_40 = lVar5;
    lVar5 = local_40;
  }
  if ((void *)TestDimensions[3]._4_8_ != (void *)0x0) {
    local_40 = lVar5;
    operator_delete((void *)TestDimensions[3]._4_8_);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCCS)
{
    const uint32_t CCSTileSize[1][2] = {128, 32}; //CCS is TileY

    const uint32_t TestDimensions[4][3] = {
    //Input dimensions in #Tiles
    {0, 0, 0}, //1x1x1
    {1, 0, 0}, //2 Tilesx1x1
    {1, 1, 0}, //2 Tilesx 2x1
    {1, 1, 1}, //2 Tilesx 2x2
    };
    uint32_t TestArraySize[2] = {1, 9};

    uint32_t RTHAlign = 128, RTVAlign = 64; //Gen9 CCS's RT should be aligned to 128x64

    uint32_t TileDimX, TileDimY, TileDimZ, WidthDivisor, HeightDivisor, TileSize;
    uint32_t ExpectedMCSBpp;
    std::vector<tuple<int, int, int, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, TestDimension index, TestArraySize index
    auto Size = BuildInputIterator(List, 4, 2);       // Send size of TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        int                TestDimIdx = std::get<3>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<4>(element); //index into TestArraySize
        TileSize                      = (Tiling == TEST_TILEYS) ? GMM_KBYTE(64) : GMM_KBYTE(4);

        //Discard if un-supported Tiling/Res_type/bpp for this test
        if(Tiling < TEST_TILEY || !(Bpp == TEST_BPP_32 ||                         //Gen8: NO TileYs/Yf, CCS not supported for !TileY/Yf/Ys/X - gen8 support tilex
                                    Bpp == TEST_BPP_64 || Bpp == TEST_BPP_128) || //LRTC not supported on <32bpp
           ResType == TEST_RESOURCE_1D ||
           ResType == TEST_RESOURCE_BUFFER) //non-MSAA CCS, 1D is showing issues CCS becoming linear (Buffer is linear)
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, true); //Depth not Supported w/ CCS. Depth only has HiZ, and IMS
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);

        GetAlignmentAndTileDimensionsForCCS(Bpp, Tiling, ResType,
                                            TileDimX, TileDimY, TileDimZ, WidthDivisor, HeightDivisor);

        gmmParams.BaseWidth64 = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
        gmmParams.BaseHeight  = (gmmParams.Type == RESOURCE_CUBE) ? gmmParams.BaseWidth64 :
                                                                   TestDimensions[TestDimIdx][1] * TileDimY + 0x1;
        gmmParams.Depth           = (gmmParams.Type == RESOURCE_3D) ? TestDimensions[TestDimIdx][2] * TileDimZ + 0x1 : 0x1;
        gmmParams.MSAA.NumSamples = 1;
        gmmParams.Flags.Gpu.CCS   = 0;

        //RT surface
        GMM_RESOURCE_INFO *RTResourceInfo;
        RTResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        //No CCS surface if RT creation failed
        if(RTResourceInfo)
        {
            gmmParams.Flags.Gpu.CCS = 1;
            GMM_RESOURCE_INFO *CCSResourceInfo;
            CCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            VerifyResourceHAlign<true>(CCSResourceInfo, RTHAlign); //Check if RT for CCS creation was aligned to CCS's RT alignment
            VerifyResourceVAlign<true>(CCSResourceInfo, RTVAlign);
            uint32_t ExpectedPitch = GMM_ULT_ALIGN((uint32_t)(GMM_ULT_ALIGN(gmmParams.BaseWidth64, RTHAlign) / WidthDivisor), CCSTileSize[0][0]);
            VerifyResourcePitch<true>(CCSResourceInfo, ExpectedPitch);
            VerifyResourcePitchInTiles<true>(CCSResourceInfo, ExpectedPitch / CCSTileSize[0][0]); // 1 tileY wide

            uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, RTVAlign); // / HeightDivisor;
            if(gmmParams.ArraySize > 1 || gmmParams.Type == RESOURCE_CUBE || gmmParams.Type == RESOURCE_3D)
            {
                uint32_t DepthSlice = gmmParams.Depth;
                //if (gmmParams.Type == RESOURCE_3D && DepthSlice > 1)
                //{
                //    ExpectedQPitch *= DepthSlice;
                //}
                //else { // Should 3D surface Aux QPitch be distance between R-slices or not
                // If it must be R-slice distance, compute 3D QPitch, remove depthslice from arraysize
                VerifyResourceQPitch<true>(CCSResourceInfo, ExpectedQPitch); //verify false, else QPitch given for RT-size not CCS
                //}
                gmmParams.ArraySize *= (gmmParams.Type == RESOURCE_3D) ? DepthSlice : //3D R-slices
                                       (gmmParams.Type == RESOURCE_CUBE) ? 6 : 1;     //cube faces treated as array slices
            }

            ExpectedQPitch /= HeightDivisor;
            uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, CCSTileSize[0][1]);
            VerifyResourceSize<true>(CCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, GMM_KBYTE(4)));

            pGmmULTClientContext->DestroyResInfoObject(CCSResourceInfo);
        } //CCS

        pGmmULTClientContext->DestroyResInfoObject(RTResourceInfo);
    } //Iterate through all input tuples

    // Mip-mapped case
}